

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O1

StandardButton
showNewMessageBox(QWidget *parent,Icon icon,QString *title,QString *text,StandardButtons buttons,
                 StandardButton defaultButton)

{
  undefined1 *puVar1;
  StandardButton SVar2;
  ButtonRole BVar3;
  int iVar4;
  QDialogButtonBox *this;
  QPushButton *button;
  int otherButtons;
  StandardButton button_00;
  long in_FS_OFFSET;
  bool bVar5;
  QMessageBox msgBox;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  QWidgetData *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((defaultButton &
      (uint)buttons.super_QFlagsStorageHelper<QMessageBox::StandardButton,_4>.
            super_QFlagsStorage<QMessageBox::StandardButton>.i) == NoButton &&
      defaultButton != NoButton) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_0050d30c:
      __stack_chk_fail();
    }
    SVar2 = QMessageBoxPrivate::showOldMessageBox
                      (parent,icon,title,text,
                       (int)buttons.super_QFlagsStorageHelper<QMessageBox::StandardButton,_4>.
                            super_QFlagsStorage<QMessageBox::StandardButton>.i,
                       defaultButton | Default,0);
  }
  else {
    local_48 = (QWidgetData *)&DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    QMessageBox::QMessageBox
              ((QMessageBox *)&local_68,icon,title,text,(StandardButtons)0x0,parent,
               (WindowFlags)0x103);
    this = (QDialogButtonBox *)
           qt_qFindChild_helper((QMessageBox *)&local_68,0,0,&QDialogButtonBox::staticMetaObject,1);
    SVar2 = FirstButton;
    do {
      puVar1 = puStack_60;
      button_00 = SVar2 & (uint)buttons.super_QFlagsStorageHelper<QMessageBox::StandardButton,_4>.
                                super_QFlagsStorage<QMessageBox::StandardButton>.i;
      if (button_00 != NoButton) {
        button = QDialogButtonBox::addButton(*(QDialogButtonBox **)(puStack_60 + 0x2f8),button_00);
        if (button != (QPushButton *)0x0) {
          puVar1[0x349] = 0;
        }
        if (*(long *)(puStack_60 + 800) == 0) {
          if (defaultButton == NoButton) {
            BVar3 = QDialogButtonBox::buttonRole(this,&button->super_QAbstractButton);
            if ((button_00 == NoButton) || (BVar3 == AcceptRole)) goto LAB_0050d294;
          }
          else if (button_00 == defaultButton) {
LAB_0050d294:
            QMessageBox::setDefaultButton((QMessageBox *)&local_68,button);
          }
        }
      }
      bVar5 = SVar2 < 0x4000001;
      SVar2 = SVar2 * 2;
    } while (bVar5);
    iVar4 = QDialog::exec((QDialog *)&local_68);
    if (iVar4 == -1) {
      SVar2 = Cancel;
    }
    else {
      SVar2 = QDialogButtonBox::standardButton
                        (*(QDialogButtonBox **)(puStack_60 + 0x2f8),
                         *(QAbstractButton **)(puStack_60 + 0x330));
    }
    QMessageBox::~QMessageBox((QMessageBox *)&local_68);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_0050d30c;
  }
  return SVar2;
}

Assistant:

static QMessageBox::StandardButton showNewMessageBox(QWidget *parent,
    QMessageBox::Icon icon,
    const QString& title, const QString& text,
    QMessageBox::StandardButtons buttons,
    QMessageBox::StandardButton defaultButton)
{
    // necessary for source compatibility with Qt 4.0 and 4.1
    // handles (Yes, No) and (Yes|Default, No)
    if (defaultButton && !(buttons & defaultButton)) {
        const int defaultButtons = defaultButton | QMessageBox::Default;
        const int otherButtons = buttons.toInt();
        const int ret = QMessageBoxPrivate::showOldMessageBox(parent, icon, title,
                                                              text, otherButtons,
                                                              defaultButtons, 0);
        return static_cast<QMessageBox::StandardButton>(ret);
    }

    QMessageBox msgBox(icon, title, text, QMessageBox::NoButton, parent);
    QDialogButtonBox *buttonBox = msgBox.findChild<QDialogButtonBox*>();
    Q_ASSERT(buttonBox != nullptr);

    uint mask = QMessageBox::FirstButton;
    while (mask <= QMessageBox::LastButton) {
        uint sb = buttons & mask;
        mask <<= 1;
        if (!sb)
            continue;
        QPushButton *button = msgBox.addButton((QMessageBox::StandardButton)sb);
        // Choose the first accept role as the default
        if (msgBox.defaultButton())
            continue;
        if ((defaultButton == QMessageBox::NoButton && buttonBox->buttonRole(button) == QDialogButtonBox::AcceptRole)
            || (defaultButton != QMessageBox::NoButton && sb == uint(defaultButton)))
            msgBox.setDefaultButton(button);
    }
    if (msgBox.exec() == -1)
        return QMessageBox::Cancel;
    return msgBox.standardButton(msgBox.clickedButton());
}